

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

void Prs_CreateVerilogPio(Cba_Ntk_t *p,Prs_Ntk_t *pNtk)

{
  int iVar1;
  int i_00;
  int f;
  int iVar2;
  int iFon;
  int iObj;
  int RangeId;
  int NameId;
  int i;
  Prs_Ntk_t *pNtk_local;
  Cba_Ntk_t *p_local;
  
  Cba_NtkCleanObjFuncs(p);
  Cba_NtkCleanObjNames(p);
  Cba_NtkCleanFonNames(p);
  Cba_NtkCleanFonRanges(p);
  Cba_NtkCleanMap(p);
  iVar1 = Vec_IntSize(&pNtk->vInouts);
  if (iVar1 != 0) {
    __assert_fail("Vec_IntSize(&pNtk->vInouts) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                  ,0x6fd,"void Prs_CreateVerilogPio(Cba_Ntk_t *, Prs_Ntk_t *)");
  }
  for (RangeId = 0; iVar1 = Vec_IntSize(&pNtk->vInputs), RangeId < iVar1; RangeId = RangeId + 1) {
    iVar1 = Vec_IntEntry(&pNtk->vInputs,RangeId);
    iVar2 = Vec_IntEntry(&pNtk->vInputsR,RangeId);
    i_00 = Cba_ObjAlloc(p,CBA_OBJ_PI,0,1);
    Cba_ObjSetName(p,i_00,iVar1);
    f = Cba_ObjFon0(p,i_00);
    Cba_FonSetRangeSign(p,f,iVar2);
    Cba_FonSetName(p,f,iVar1);
    Cba_NtkSetMap(p,iVar1,i_00);
  }
  for (RangeId = 0; iVar1 = Vec_IntSize(&pNtk->vOutputs), RangeId < iVar1; RangeId = RangeId + 1) {
    iVar1 = Vec_IntEntry(&pNtk->vOutputs,RangeId);
    Vec_IntEntry(&pNtk->vOutputsR,RangeId);
    iVar2 = Cba_ObjAlloc(p,CBA_OBJ_PO,1,0);
    Cba_ObjSetName(p,iVar2,iVar1);
    Cba_NtkSetMap(p,iVar1,iVar2);
  }
  for (RangeId = 0; iVar1 = Vec_IntSize(&pNtk->vOrder), RangeId < iVar1; RangeId = RangeId + 1) {
    iVar1 = Vec_IntEntry(&pNtk->vOrder,RangeId);
    iVar1 = Abc_Lit2Var2(iVar1);
    iVar1 = Prs_CreateVerilogFindFon(p,iVar1);
    if (iVar1 != 0) {
      Vec_IntPush(&p->vOrder,iVar1);
    }
  }
  return;
}

Assistant:

void Prs_CreateVerilogPio( Cba_Ntk_t * p, Prs_Ntk_t * pNtk )
{
    int i, NameId, RangeId, iObj, iFon;
    Cba_NtkCleanObjFuncs( p );
    Cba_NtkCleanObjNames( p );
    Cba_NtkCleanFonNames( p );
    Cba_NtkCleanFonRanges( p );
    // create inputs
    Cba_NtkCleanMap( p );
    assert( Vec_IntSize(&pNtk->vInouts) == 0 );
    Vec_IntForEachEntryTwo( &pNtk->vInputs, &pNtk->vInputsR, NameId, RangeId, i )
    {
        iObj = Cba_ObjAlloc( p, CBA_OBJ_PI, 0, 1 );
        Cba_ObjSetName( p, iObj, NameId ); // direct name
        iFon = Cba_ObjFon0(p, iObj);
        Cba_FonSetRangeSign( p, iFon, RangeId );
        Cba_FonSetName( p, iFon, NameId );
        Cba_NtkSetMap( p, NameId, iObj );
    }
    // create outputs
    Vec_IntForEachEntryTwo( &pNtk->vOutputs, &pNtk->vOutputsR, NameId, RangeId, i )
    {
        iObj = Cba_ObjAlloc( p, CBA_OBJ_PO, 1, 0 );
        Cba_ObjSetName( p, iObj, NameId ); // direct name
        Cba_NtkSetMap( p, NameId, iObj );
    }
    // create order
    Vec_IntForEachEntry( &pNtk->vOrder, NameId, i )
    {
        iObj = Prs_CreateVerilogFindFon( p, Abc_Lit2Var2(NameId) ); // labeled name
        if ( iObj )
            Vec_IntPush( &p->vOrder, iObj );
    }
}